

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O2

string * __thiscall
arbiter::Endpoint::prefixedRoot_abi_cxx11_(string *__return_storage_ptr__,Endpoint *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  softPrefix_abi_cxx11_(&local_30,this);
  ::std::__cxx11::string::string((string *)&local_50,(string *)&this->m_root);
  ::std::operator+(__return_storage_ptr__,&local_30,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Endpoint::prefixedRoot() const
{
    return softPrefix() + root();
}